

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_perftest.cc
# Opt level: O3

int main(void)

{
  uint uVar1;
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  int j;
  int iVar12;
  float fVar13;
  int delta;
  vector<int,_std::allocator<int>_> times;
  uint64_t slash_bits;
  size_t len;
  char buf [200];
  int local_12c;
  uint *local_128;
  iterator iStack_120;
  int *local_118;
  uint64_t local_108;
  size_t local_100;
  char local_f8 [72];
  undefined4 local_b0;
  undefined3 uStack_ac;
  
  local_128 = (uint *)0x0;
  iStack_120._M_current = (int *)0x0;
  local_118 = (int *)0x0;
  local_100 = 0x4e;
  pcVar8 = "../../third_party/WebKit/Source/WebCore/platform/leveldb/LevelDBWriteBatch.cpp";
  pcVar10 = local_f8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar10 = *(undefined8 *)pcVar8;
    pcVar8 = pcVar8 + 8;
    pcVar10 = pcVar10 + 8;
  }
  local_b0 = 0x632e6863;
  uStack_ac = 0x7070;
  iVar12 = 0;
  do {
    iVar2 = GetTimeMillis();
    iVar7 = 2000000;
    do {
      CanonicalizePath(local_f8,&local_100,&local_108);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    iVar3 = GetTimeMillis();
    local_12c = (int)iVar3 - (int)iVar2;
    if (iStack_120._M_current == local_118) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_128,iStack_120,&local_12c);
    }
    else {
      *iStack_120._M_current = local_12c;
      iStack_120._M_current = iStack_120._M_current + 1;
    }
    iVar12 = iVar12 + 1;
  } while (iVar12 != 5);
  uVar4 = (long)iStack_120._M_current - (long)local_128 >> 2;
  uVar6 = (ulong)*local_128;
  uVar9 = uVar6;
  if ((uint *)iStack_120._M_current == local_128) {
    fVar13 = 0.0;
  }
  else {
    fVar13 = 0.0;
    lVar5 = 0;
    uVar11 = uVar6;
    do {
      uVar1 = local_128[lVar5];
      uVar6 = uVar11;
      if ((int)uVar11 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      if ((int)uVar1 < (int)uVar9) {
        uVar9 = (ulong)uVar1;
        uVar6 = uVar11;
      }
      fVar13 = fVar13 + (float)(int)uVar1;
      lVar5 = lVar5 + 1;
      uVar11 = uVar6;
    } while (uVar4 + (uVar4 == 0) != lVar5);
  }
  printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar13 / (float)uVar4),0),uVar9,uVar6);
  if (local_128 != (uint *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  return 0;
}

Assistant:

int main() {
  vector<int> times;

  char buf[200];
  size_t len = strlen(kPath);
  strcpy(buf, kPath);

  for (int j = 0; j < 5; ++j) {
    const int kNumRepetitions = 2000000;
    int64_t start = GetTimeMillis();
    uint64_t slash_bits;
    for (int i = 0; i < kNumRepetitions; ++i) {
      CanonicalizePath(buf, &len, &slash_bits);
    }
    int delta = (int)(GetTimeMillis() - start);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());
}